

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O3

int fp_test_hdu(undefined8 infptr,fitsfile *outfptr,undefined8 outfptr2,int *param_4)

{
  uint uVar1;
  int iVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  char lossless [4];
  float row_cpu;
  float row_elapse;
  float unpackcpu;
  float packcpu;
  char ctype [20];
  float whole_cpu;
  float whole_elapse;
  float elapse;
  long headstart;
  int comptype;
  int hdutype;
  unsigned_long hdusum;
  unsigned_long datasum2;
  unsigned_long datasum1;
  long dataend;
  long datastart;
  char in_stack_0000049c;
  undefined4 local_e0;
  int local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc [2];
  undefined2 local_c4;
  double local_b0;
  double local_a8;
  double local_a0;
  float local_94;
  float local_90;
  float local_8c;
  undefined8 local_88;
  double local_80;
  double local_78;
  timeval local_70;
  int local_60;
  undefined1 local_5c [4];
  undefined1 local_58 [8];
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_dc = 0;
  local_cc[0] = 0.0;
  local_d0 = 0.0;
  if (*param_4 != 0) {
    return 0;
  }
  local_e0 = local_e0 & 0xffffff00;
  fits_get_compression_type(outfptr,&local_60,&local_dc);
  if (local_60 < 0x16) {
    if (local_60 == -1) {
      local_c4 = (ushort)local_c4._1_1_ << 8;
      local_cc[1] = 3300.9565;
    }
    else {
      if (local_60 != 0xb) {
        if (local_60 != 0x15) {
LAB_0010920f:
          printf("%s","Error: unsupported image compression type ");
          iVar2 = 0x19d;
          goto LAB_00109565;
        }
        local_c4 = 0x31;
        goto LAB_00109205;
      }
      local_c4 = (ushort)local_c4._1_1_ << 8;
      local_cc[1] = 3124.5825;
    }
  }
  else if (local_60 == 0x16) {
    local_c4 = 0x32;
LAB_00109205:
    local_cc[1] = 1.3512547e+10;
  }
  else if (local_60 == 0x1f) {
    local_c4 = (ushort)local_c4._1_1_ << 8;
    local_cc[1] = 3.3772216e+09;
  }
  else {
    if (local_60 != 0x29) goto LAB_0010920f;
    local_c4 = 0x50;
    local_cc[1] = 2.1733082e+08;
  }
  gettimeofday(&local_70,(__timezone_ptr_t)0x0);
  startsec = local_70.tv_sec;
  startmilli = (int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_70.tv_usec),8) >> 7) -
               (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_70.tv_usec),0xc) >> 0x1f);
  scpu = clock();
  fits_img_compress(infptr,outfptr,&local_dc);
  gettime(&local_8c,local_cc,&local_dc);
  fits_read_image_speed(outfptr,&local_90,&local_94,&local_d4,&local_d8,&local_dc);
  if (local_dc == 0) {
    gettimeofday(&local_70,(__timezone_ptr_t)0x0);
    startsec = local_70.tv_sec;
    startmilli = (int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_70.tv_usec),8) >> 7) -
                 (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_70.tv_usec),0xc) >> 0x1f);
    scpu = clock();
    local_88 = outfptr2;
    fits_img_decompress(outfptr,outfptr2,&local_dc);
    gettime(&local_8c,&local_d0,&local_dc);
    ffghad(infptr,&local_70,&local_38,&local_40,&local_dc);
    local_a8 = (double)CONCAT44(local_a8._4_4_,(float)((double)(local_40 - local_38) / 1000000.0));
    ffghad(outfptr,&local_70,&local_38,&local_40,&local_dc);
    fVar3 = (float)((double)(local_40 - local_38) / 1000000.0);
    local_a0 = (double)(local_a8._0_4_ / fVar3);
    local_b0 = (double)CONCAT44(local_b0._4_4_,fVar3);
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      local_a0 = 0.0;
    }
    ffgcks(infptr,&local_48,local_58,&local_dc);
    ffgcks(local_88,&local_50,local_58,&local_dc);
    if (local_48 == local_50) {
      local_e0 = 0x736559;
    }
    else {
      uVar1 = local_e0 >> 0x10;
      local_e0 = CONCAT22((ushort)uVar1 & 0xff00,0x6f4e);
    }
    dVar4 = (double)local_a8._0_4_;
    dVar5 = (double)local_b0._0_4_;
    local_78 = (double)local_cc[0];
    local_80 = (double)local_d0;
    local_a8 = (double)local_90;
    local_b0 = (double)local_94;
    printf("       %-5s %6.2f %7.2f ->%7.2f %7.2f %7.2f %s %5.3f %5.3f %5.3f %5.3f\n",local_a0,dVar4
           ,dVar5,local_cc + 1,&local_e0);
    if (in_stack_0000049c != '\0') {
      fprintf((FILE *)outreport," %6.3f %5.2f %5.2f %s %7.3f %7.3f %7.3f %7.3f",local_a0,local_78,
              local_80,local_a8,local_b0,(double)local_d4,(double)local_d8,&local_e0);
    }
    ffdhdu(outfptr,local_5c,&local_dc);
    ffdhdu(local_88,local_5c,&local_dc);
  }
  else {
    printf("       %-5s     (unable to compress image)\n",local_cc + 1);
  }
  iVar2 = 0;
  if (local_dc != 0x19d) {
    iVar2 = local_dc;
  }
LAB_00109565:
  *param_4 = iVar2;
  return 0;
}

Assistant:

int fp_test_hdu (fitsfile *infptr, fitsfile *outfptr, fitsfile *outfptr2, 
	fpstate fpvar, int *status)
{
   /*   This routine is only used for performance testing of image HDUs. */
   /*   Use fp_test_table for testing binary table HDUs.    */

	int stat = 0, hdutype, comptype;
        char ctype[20], lossless[4];
	long headstart, datastart, dataend;
	float origdata = 0., compressdata = 0.;
	float compratio = 0., packcpu = 0., unpackcpu = 0.;
	float elapse, whole_elapse, row_elapse, whole_cpu, row_cpu;
	unsigned long datasum1, datasum2, hdusum;

	if (*status) return(0);

	origdata = 0;
	compressdata = 0;
	compratio = 0.;
	lossless[0] = '\0';

	fits_get_compression_type(outfptr, &comptype, &stat);
	if (comptype == RICE_1)
		strcpy(ctype, "RICE");
	else if (comptype == GZIP_1)
		strcpy(ctype, "GZIP1");
	else if (comptype == GZIP_2)
		strcpy(ctype, "GZIP2");/*
	else if (comptype == BZIP2_1)
		strcpy(ctype, "BZIP2");
*/
	else if (comptype == PLIO_1)
		strcpy(ctype, "PLIO");
	else if (comptype == HCOMPRESS_1)
		strcpy(ctype, "HCOMP");
	else if (comptype == NOCOMPRESS)
		strcpy(ctype, "NONE");
	else {
	      fp_msg ("Error: unsupported image compression type ");
	      *status = DATA_COMPRESSION_ERR;
	      return(0);
	}

	/* -------------- COMPRESS the image ------------------ */

	marktime(&stat);
	
	fits_img_compress (infptr, outfptr, &stat);

	/* get elapsped times */
	gettime(&elapse, &packcpu, &stat);

	/* get elapsed and cpu times need to read the compressed image */
	fits_read_image_speed (outfptr, &whole_elapse, &whole_cpu, 
	   &row_elapse, &row_cpu, &stat);

        if (!stat) {

		/* -------------- UNCOMPRESS the image ------------------ */

                /* remove any cached uncompressed tile 
		  (dangerous to directly modify the structure!) */
        /*        (outfptr->Fptr)->tilerow = 0; */
		marktime(&stat);

 	       fits_img_decompress (outfptr, outfptr2, &stat);

		/* get elapsped times */
		gettime(&elapse, &unpackcpu, &stat);

		/* ----------------------------------------------------- */


		/* get sizes of original and compressed images */

		fits_get_hduaddr(infptr, &headstart, &datastart, &dataend, &stat);
		origdata = (float) ((dataend - datastart)/1000000.);
		
		fits_get_hduaddr(outfptr, &headstart, &datastart, &dataend, &stat);
		compressdata = (float) ((dataend - datastart)/1000000.);

		if (compressdata != 0)
			compratio = (float) origdata / (float) compressdata;

		/* is this uncompressed image identical to the original? */

		fits_get_chksum(infptr, &datasum1, &hdusum, &stat);	    
		fits_get_chksum(outfptr2, &datasum2, &hdusum, &stat);

		if ( datasum1 == datasum2) {
			strcpy(lossless, "Yes");
		} else {
			strcpy(lossless, "No");
		}

		printf("       %-5s %6.2f %7.2f ->%7.2f %7.2f %7.2f %s %5.3f %5.3f %5.3f %5.3f\n", 
			ctype, compratio, origdata, compressdata, 
			packcpu, unpackcpu, lossless, whole_elapse, whole_cpu,
			row_elapse, row_cpu);


		if (fpvar.outfile[0]) {
		    fprintf(outreport," %6.3f %5.2f %5.2f %s %7.3f %7.3f %7.3f %7.3f", 
		       compratio, packcpu, unpackcpu, lossless,  whole_elapse, whole_cpu,
		       row_elapse, row_cpu);
		}

 	       /* delete the output HDUs to concerve disk space */

		fits_delete_hdu(outfptr, &hdutype, &stat);
		fits_delete_hdu(outfptr2, &hdutype, &stat);

	} else {
		printf("       %-5s     (unable to compress image)\n", ctype);
	}

	/* try to recover from any compression errors */
	if (stat == DATA_COMPRESSION_ERR) stat = 0;

	*status = stat;
        return(0);
}